

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int HistogramCombineGreedy(VP8LHistogramSet *image_histo,int *num_used)

{
  long lVar1;
  int iVar2;
  HistogramPair *pair;
  VP8LHistogram **in_RSI;
  HistoQueue *in_RDI;
  HistogramPair *p;
  int idx2;
  int idx1;
  HistoQueue histo_queue;
  VP8LHistogram **histograms;
  int j;
  int i;
  int image_histo_size;
  int ok;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  VP8LHistogram *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffe0;
  int iVar3;
  int iVar4;
  int idx2_00;
  int idx1_00;
  
  idx1_00 = 0;
  idx2_00 = *(int *)&in_RDI->queue;
  lVar1 = *(long *)&in_RDI->size;
  iVar2 = HistoQueueInit((HistoQueue *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                         ,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  if (iVar2 != 0) {
    for (iVar2 = 0; iVar2 < idx2_00; iVar2 = iVar2 + 1) {
      iVar4 = iVar2;
      if (*(long *)(*(long *)&in_RDI->size + (long)iVar2 * 8) != 0) {
        while (in_stack_ffffffffffffffe0 = iVar4 + 1, in_stack_ffffffffffffffe0 < idx2_00) {
          iVar4 = in_stack_ffffffffffffffe0;
          if (*(long *)(*(long *)&in_RDI->size + (long)in_stack_ffffffffffffffe0 * 8) != 0) {
            HistoQueuePush(in_RDI,in_RSI,idx1_00,idx2_00,CONCAT44(iVar2,in_stack_ffffffffffffffe0));
            iVar4 = in_stack_ffffffffffffffe0;
          }
        }
      }
    }
    while (0 < in_stack_ffffffffffffffd0) {
      iVar2 = *(int *)&in_stack_ffffffffffffffc8->literal_;
      iVar4 = *(int *)((long)&in_stack_ffffffffffffffc8->literal_ + 4);
      HistogramAdd((VP8LHistogram *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8,(VP8LHistogram *)CONCAT44(iVar2,iVar4));
      *(undefined8 *)(*(long *)(lVar1 + (long)iVar2 * 8) + 0xcb0) =
           *(undefined8 *)(in_stack_ffffffffffffffc8->red_ + 2);
      HistogramSetRemoveHistogram((VP8LHistogramSet *)in_RDI,iVar4,(int *)in_RSI);
      iVar3 = 0;
      while (iVar3 < in_stack_ffffffffffffffd0) {
        pair = (HistogramPair *)(in_stack_ffffffffffffffc8->red_ + (long)iVar3 * 6 + -2);
        if ((((pair->idx1 == iVar2) || (pair->idx2 == iVar2)) || (pair->idx1 == iVar4)) ||
           (pair->idx2 == iVar4)) {
          HistoQueuePopPair((HistoQueue *)&stack0xffffffffffffffc8,pair);
        }
        else {
          HistoQueueUpdateHead((HistoQueue *)&stack0xffffffffffffffc8,pair);
          iVar3 = iVar3 + 1;
        }
      }
      for (iVar4 = 0; iVar4 < *(int *)&in_RDI->queue; iVar4 = iVar4 + 1) {
        if ((iVar4 != iVar2) && (*(long *)(*(long *)&in_RDI->size + (long)iVar4 * 8) != 0)) {
          HistoQueuePush(in_RDI,in_RSI,idx1_00,idx2_00,CONCAT44(iVar4,in_stack_ffffffffffffffe0));
        }
      }
    }
    idx1_00 = 1;
  }
  HistoQueueClear((HistoQueue *)0x1c750e);
  return idx1_00;
}

Assistant:

static int HistogramCombineGreedy(VP8LHistogramSet* const image_histo,
                                  int* const num_used) {
  int ok = 0;
  const int image_histo_size = image_histo->size;
  int i, j;
  VP8LHistogram** const histograms = image_histo->histograms;
  // Priority queue of histogram pairs.
  HistoQueue histo_queue;

  // image_histo_size^2 for the queue size is safe. If you look at
  // HistogramCombineGreedy, and imagine that UpdateQueueFront always pushes
  // data to the queue, you insert at most:
  // - image_histo_size*(image_histo_size-1)/2 (the first two for loops)
  // - image_histo_size - 1 in the last for loop at the first iteration of
  //   the while loop, image_histo_size - 2 at the second iteration ...
  //   therefore image_histo_size*(image_histo_size-1)/2 overall too
  if (!HistoQueueInit(&histo_queue, image_histo_size * image_histo_size)) {
    goto End;
  }

  for (i = 0; i < image_histo_size; ++i) {
    if (image_histo->histograms[i] == NULL) continue;
    for (j = i + 1; j < image_histo_size; ++j) {
      // Initialize queue.
      if (image_histo->histograms[j] == NULL) continue;
      HistoQueuePush(&histo_queue, histograms, i, j, 0);
    }
  }

  while (histo_queue.size > 0) {
    const int idx1 = histo_queue.queue[0].idx1;
    const int idx2 = histo_queue.queue[0].idx2;
    HistogramAdd(histograms[idx2], histograms[idx1], histograms[idx1]);
    histograms[idx1]->bit_cost_ = histo_queue.queue[0].cost_combo;

    // Remove merged histogram.
    HistogramSetRemoveHistogram(image_histo, idx2, num_used);

    // Remove pairs intersecting the just combined best pair.
    for (i = 0; i < histo_queue.size;) {
      HistogramPair* const p = histo_queue.queue + i;
      if (p->idx1 == idx1 || p->idx2 == idx1 ||
          p->idx1 == idx2 || p->idx2 == idx2) {
        HistoQueuePopPair(&histo_queue, p);
      } else {
        HistoQueueUpdateHead(&histo_queue, p);
        ++i;
      }
    }

    // Push new pairs formed with combined histogram to the queue.
    for (i = 0; i < image_histo->size; ++i) {
      if (i == idx1 || image_histo->histograms[i] == NULL) continue;
      HistoQueuePush(&histo_queue, image_histo->histograms, idx1, i, 0);
    }
  }

  ok = 1;

 End:
  HistoQueueClear(&histo_queue);
  return ok;
}